

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardswish_x86_avx.cpp
# Opt level: O0

int __thiscall
ncnn::HardSwish_x86_avx::forward_inplace(HardSwish_x86_avx *this,Mat *bottom_top_blob,Option *opt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [24];
  float *pfVar15;
  long in_RSI;
  long *in_RDI;
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  __m256 _ans_2;
  __m256 _p_2;
  __m256 _one_2;
  __m256 _zero_2;
  int i_2;
  float *ptr_2;
  int q_2;
  __m128 _ans_1;
  __m128 _p_1;
  int i_1;
  __m128 _one_1;
  __m128 _zero_1;
  float *ptr_1;
  int q_1;
  __m256 _ans;
  __m256 _p;
  int i;
  __m256 _one;
  __m256 _zero;
  float *ptr;
  int q;
  int elempack;
  int size;
  int channels;
  int h;
  int w;
  undefined8 in_stack_fffffffffffff568;
  Mat *this_00;
  Mat *in_stack_fffffffffffff570;
  undefined1 local_a60 [8];
  undefined8 uStack_a58;
  undefined8 uStack_a50;
  undefined8 uStack_a48;
  int local_9cc;
  Mat local_9c8;
  float *local_980;
  int local_974;
  undefined8 local_970;
  undefined8 uStack_968;
  void *local_960;
  int *piStack_958;
  int local_944;
  undefined8 local_940;
  undefined8 uStack_938;
  undefined8 local_930;
  undefined8 uStack_928;
  Mat local_918;
  Mat *local_8d0;
  int local_8c4;
  undefined1 local_8c0 [8];
  undefined8 uStack_8b8;
  undefined8 uStack_8b0;
  undefined8 uStack_8a8;
  undefined8 local_8a0;
  undefined8 uStack_898;
  undefined8 uStack_890;
  undefined8 uStack_888;
  int local_864;
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 uStack_850;
  undefined8 uStack_848;
  undefined8 local_840;
  undefined8 uStack_838;
  undefined8 uStack_830;
  undefined8 uStack_828;
  Mat local_7f8;
  float *local_7b0;
  int local_7a8;
  int local_7a4;
  int local_7a0;
  int local_79c;
  int local_798;
  int local_794;
  uint local_770;
  uint local_76c;
  undefined4 local_768;
  undefined4 local_764;
  uint local_760;
  uint local_75c;
  undefined4 local_758;
  undefined4 local_754;
  float *local_750;
  float *local_748;
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 uStack_730;
  undefined8 uStack_728;
  undefined8 local_720;
  undefined8 uStack_718;
  undefined8 uStack_710;
  undefined8 uStack_708;
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 uStack_6f0;
  undefined8 uStack_6e8;
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined8 uStack_6d0;
  undefined8 uStack_6c8;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 uStack_6b0;
  undefined8 uStack_6a8;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 uStack_690;
  undefined8 uStack_688;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 uStack_670;
  undefined8 uStack_668;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 uStack_650;
  undefined8 uStack_648;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 uStack_610;
  undefined8 uStack_608;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 uStack_5d0;
  undefined8 uStack_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 uStack_590;
  undefined8 uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 uStack_570;
  undefined8 uStack_568;
  float local_560;
  float fStack_55c;
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  float fStack_544;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  float local_520;
  float fStack_51c;
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  float *local_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 uStack_430;
  undefined8 uStack_428;
  float *local_408;
  float local_400;
  float fStack_3fc;
  float fStack_3f8;
  float fStack_3f4;
  float local_3e4;
  float local_3e0;
  float fStack_3dc;
  float fStack_3d8;
  float fStack_3d4;
  float local_3c4;
  undefined4 local_3c0;
  undefined4 uStack_3bc;
  undefined4 uStack_3b8;
  undefined4 uStack_3b4;
  undefined4 local_3a4;
  undefined4 local_3a0;
  undefined4 uStack_39c;
  undefined4 uStack_398;
  undefined4 uStack_394;
  undefined4 local_38c;
  Mat *local_388;
  undefined8 local_380;
  undefined8 uStack_378;
  float local_370;
  float fStack_36c;
  float fStack_368;
  float fStack_364;
  void *local_360;
  int *piStack_358;
  undefined8 local_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 local_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 local_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 local_2f0;
  undefined8 uStack_2e8;
  void *local_2e0;
  int *piStack_2d8;
  Mat *local_2c8;
  undefined1 local_2c0 [16];
  undefined1 auStack_2b0 [16];
  undefined4 local_2a0;
  undefined4 local_29c;
  undefined4 local_298;
  undefined4 local_294;
  undefined4 local_290;
  undefined4 local_28c;
  undefined4 local_288;
  undefined4 local_284;
  undefined1 local_280 [32];
  undefined4 local_260;
  undefined4 local_25c;
  undefined4 local_258;
  undefined4 local_254;
  undefined4 local_250;
  undefined4 local_24c;
  undefined4 local_248;
  undefined4 local_244;
  undefined1 local_240 [16];
  undefined1 auStack_230 [16];
  uint local_220;
  uint local_21c;
  uint local_218;
  uint local_214;
  uint local_210;
  uint local_20c;
  uint local_208;
  uint local_204;
  undefined1 local_200 [32];
  uint local_1e0;
  uint local_1dc;
  uint local_1d8;
  uint local_1d4;
  uint local_1d0;
  uint local_1cc;
  uint local_1c8;
  uint local_1c4;
  undefined1 local_1c0 [16];
  undefined1 auStack_1b0 [16];
  undefined4 local_1a0;
  undefined4 local_19c;
  undefined4 local_198;
  undefined4 local_194;
  undefined4 local_190;
  undefined4 local_18c;
  undefined4 local_188;
  undefined4 local_184;
  undefined1 local_180 [32];
  undefined4 local_160;
  undefined4 local_15c;
  undefined4 local_158;
  undefined4 local_154;
  undefined4 local_150;
  undefined4 local_14c;
  undefined4 local_148;
  undefined4 local_144;
  undefined1 local_140 [16];
  undefined1 auStack_130 [16];
  uint local_120;
  uint local_11c;
  uint local_118;
  uint local_114;
  uint local_110;
  uint local_10c;
  uint local_108;
  uint local_104;
  undefined1 local_100 [32];
  uint local_e0;
  uint local_dc;
  uint local_d8;
  uint local_d4;
  uint local_d0;
  uint local_cc;
  uint local_c8;
  uint local_c4;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  float local_a0;
  float fStack_9c;
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  float fStack_84;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  float local_60;
  float fStack_5c;
  float fStack_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float fStack_48;
  float fStack_44;
  
  local_794 = *(int *)(in_RSI + 0x2c);
  local_798 = *(int *)(in_RSI + 0x30);
  local_79c = *(int *)(in_RSI + 0x38);
  local_7a0 = local_794 * local_798;
  local_7a4 = *(int *)(in_RSI + 0x18);
  if (local_7a4 == 8) {
    local_7a4 = 8;
    for (local_7a8 = 0; local_7a8 < local_79c; local_7a8 = local_7a8 + 1) {
      ncnn::Mat::channel(in_stack_fffffffffffff570,(int)((ulong)in_stack_fffffffffffff568 >> 0x20));
      pfVar15 = ncnn::Mat::operator_cast_to_float_(&local_7f8);
      ncnn::Mat::~Mat((Mat *)0x8e7c91);
      local_754 = 0;
      local_284 = 0;
      local_288 = 0;
      local_28c = 0;
      local_290 = 0;
      local_294 = 0;
      local_298 = 0;
      local_29c = 0;
      local_2a0 = 0;
      auVar1 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
      auVar1 = vinsertps_avx(auVar1,ZEXT416(0),0x20);
      local_2c0 = vinsertps_avx(auVar1,ZEXT416(0),0x30);
      auVar1 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
      auVar1 = vinsertps_avx(auVar1,ZEXT416(0),0x20);
      auStack_2b0 = vinsertps_avx(auVar1,ZEXT416(0),0x30);
      local_840 = local_2c0._0_8_;
      uStack_838 = local_2c0._8_8_;
      uStack_830 = auStack_2b0._0_8_;
      uStack_828 = auStack_2b0._8_8_;
      local_758 = 0x3f800000;
      local_244 = 0x3f800000;
      local_248 = 0x3f800000;
      local_24c = 0x3f800000;
      local_250 = 0x3f800000;
      local_254 = 0x3f800000;
      local_258 = 0x3f800000;
      local_25c = 0x3f800000;
      local_260 = 0x3f800000;
      auVar1 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar1 = vinsertps_avx(auVar1,ZEXT416(0x3f800000),0x20);
      auVar1 = vinsertps_avx(auVar1,ZEXT416(0x3f800000),0x30);
      auVar2 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x20);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x30);
      auVar16._16_16_ = auVar1;
      auVar16._0_16_ = auVar2;
      local_280._0_8_ = auVar2._0_8_;
      local_280._8_8_ = auVar2._8_8_;
      local_280._16_8_ = auVar1._0_8_;
      local_280._24_8_ = auVar1._8_8_;
      local_860 = local_280._0_8_;
      uStack_858 = local_280._8_8_;
      uStack_850 = local_280._16_8_;
      uStack_848 = local_280._24_8_;
      local_7b0 = pfVar15;
      for (local_864 = 0; local_864 < local_7a0; local_864 = local_864 + 1) {
        local_748 = local_7b0;
        local_8a0 = *(undefined8 *)local_7b0;
        uStack_898 = *(undefined8 *)(local_7b0 + 2);
        uStack_890 = *(undefined8 *)(local_7b0 + 4);
        uStack_888 = *(undefined8 *)(local_7b0 + 6);
        local_75c = *(uint *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
        auVar1 = vinsertps_avx(ZEXT416(local_75c),ZEXT416(local_75c),0x10);
        auVar1 = vinsertps_avx(auVar1,ZEXT416(local_75c),0x20);
        local_240 = vinsertps_avx(auVar1,ZEXT416(local_75c),0x30);
        auVar1 = vinsertps_avx(ZEXT416(local_75c),ZEXT416(local_75c),0x10);
        auVar1 = vinsertps_avx(auVar1,ZEXT416(local_75c),0x20);
        auStack_230 = vinsertps_avx(auVar1,ZEXT416(local_75c),0x30);
        local_760 = *(uint *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
        auVar1 = vinsertps_avx(ZEXT416(local_760),ZEXT416(local_760),0x10);
        auVar1 = vinsertps_avx(auVar1,ZEXT416(local_760),0x20);
        auVar1 = vinsertps_avx(auVar1,ZEXT416(local_760),0x30);
        auVar3 = vinsertps_avx(ZEXT416(local_760),ZEXT416(local_760),0x10);
        auVar3 = vinsertps_avx(auVar3,ZEXT416(local_760),0x20);
        auVar3 = vinsertps_avx(auVar3,ZEXT416(local_760),0x30);
        auVar17._16_16_ = auVar1;
        auVar17._0_16_ = auVar3;
        local_200._0_8_ = auVar3._0_8_;
        local_6c0 = local_200._0_8_;
        local_200._8_8_ = auVar3._8_8_;
        uStack_6b8 = local_200._8_8_;
        local_200._16_8_ = auVar1._0_8_;
        uStack_6b0 = local_200._16_8_;
        local_200._24_8_ = auVar1._8_8_;
        uStack_6a8 = local_200._24_8_;
        local_6e0 = local_240._0_8_;
        uStack_6d8 = local_240._8_8_;
        uStack_6d0 = auStack_230._0_8_;
        uStack_6c8 = auStack_230._8_8_;
        local_6a0._0_4_ = (float)local_8a0;
        local_560 = (float)local_6a0;
        local_6a0._4_4_ = (float)((ulong)local_8a0 >> 0x20);
        fStack_55c = local_6a0._4_4_;
        uStack_698._0_4_ = (float)uStack_898;
        fStack_558 = (float)uStack_698;
        uStack_698._4_4_ = (float)((ulong)uStack_898 >> 0x20);
        fStack_554 = uStack_698._4_4_;
        uStack_690._0_4_ = (float)uStack_890;
        fStack_550 = (float)uStack_690;
        uStack_690._4_4_ = (float)((ulong)uStack_890 >> 0x20);
        fStack_54c = uStack_690._4_4_;
        uStack_688._0_4_ = (float)uStack_888;
        fStack_548 = (float)uStack_688;
        uStack_688._4_4_ = (float)((ulong)uStack_888 >> 0x20);
        fStack_544 = uStack_688._4_4_;
        local_580._0_4_ = auVar3._0_4_;
        local_580._4_4_ = auVar3._4_4_;
        uStack_578._0_4_ = auVar3._8_4_;
        uStack_578._4_4_ = auVar3._12_4_;
        uStack_570._0_4_ = auVar1._0_4_;
        uStack_570._4_4_ = auVar1._4_4_;
        uStack_568._0_4_ = auVar1._8_4_;
        local_a0 = (float)local_6a0 * (float)local_580;
        fStack_9c = local_6a0._4_4_ * local_580._4_4_;
        fStack_98 = (float)uStack_698 * (float)uStack_578;
        fStack_94 = uStack_698._4_4_ * uStack_578._4_4_;
        fStack_90 = (float)uStack_690 * (float)uStack_570;
        fStack_8c = uStack_690._4_4_ * uStack_570._4_4_;
        fStack_88 = (float)uStack_688 * (float)uStack_568;
        local_c0._0_4_ = local_240._0_4_;
        local_c0._4_4_ = local_240._4_4_;
        uStack_b8._0_4_ = local_240._8_4_;
        uStack_b8._4_4_ = local_240._12_4_;
        uStack_b0._0_4_ = auStack_230._0_4_;
        uStack_b0._4_4_ = auStack_230._4_4_;
        uStack_a8._0_4_ = auStack_230._8_4_;
        uStack_a8._4_4_ = auStack_230._12_4_;
        local_8c0._4_4_ = fStack_9c + local_c0._4_4_;
        local_8c0._0_4_ = local_a0 + (float)local_c0;
        uStack_8b8._0_4_ = fStack_98 + (float)uStack_b8;
        uStack_8b8._4_4_ = fStack_94 + uStack_b8._4_4_;
        uStack_8b0._0_4_ = fStack_90 + (float)uStack_b0;
        uStack_8b0._4_4_ = fStack_8c + uStack_b0._4_4_;
        auVar14 = _local_8c0;
        uStack_8a8._0_4_ = fStack_88 + (float)uStack_a8;
        uStack_8a8._4_4_ = uStack_688._4_4_ + uStack_a8._4_4_;
        auVar18 = _local_8c0;
        local_620 = local_8c0;
        uStack_618 = uStack_8b8;
        uStack_8b0 = auVar14._16_8_;
        uStack_610 = uStack_8b0;
        uStack_8a8 = auVar18._24_8_;
        uStack_608 = uStack_8a8;
        local_640 = local_2c0._0_8_;
        uStack_638 = local_2c0._8_8_;
        uStack_630 = auStack_2b0._0_8_;
        uStack_628 = auStack_2b0._8_8_;
        auVar11._16_8_ = uStack_8b0;
        auVar11._0_16_ = _local_8c0;
        auVar11._24_8_ = uStack_8a8;
        auVar10._16_8_ = auStack_2b0._0_8_;
        auVar10._0_16_ = local_2c0;
        auVar10._24_8_ = auStack_2b0._8_8_;
        auVar18 = vmaxps_avx(auVar11,auVar10);
        local_8c0 = auVar18._0_8_;
        local_5a0 = local_8c0;
        uStack_8b8 = auVar18._8_8_;
        uStack_598 = uStack_8b8;
        uStack_8b0 = auVar18._16_8_;
        uStack_590 = uStack_8b0;
        uStack_8a8 = auVar18._24_8_;
        uStack_588 = uStack_8a8;
        local_5c0 = local_280._0_8_;
        uStack_5b8 = local_280._8_8_;
        uStack_5b0 = local_280._16_8_;
        uStack_5a8 = local_280._24_8_;
        auVar13._16_8_ = local_280._16_8_;
        auVar13._0_16_ = auVar2;
        auVar13._24_8_ = local_280._24_8_;
        auVar18 = vminps_avx(auVar18,auVar13);
        local_8c0 = auVar18._0_8_;
        uVar5 = local_8c0;
        uStack_8b8 = auVar18._8_8_;
        uVar6 = uStack_8b8;
        uStack_8b0 = auVar18._16_8_;
        uVar7 = uStack_8b0;
        uStack_8a8 = auVar18._24_8_;
        uVar8 = uStack_8a8;
        local_4a0._0_4_ = auVar18._0_4_;
        local_4a0._4_4_ = auVar18._4_4_;
        uStack_498._0_4_ = auVar18._8_4_;
        uStack_498._4_4_ = auVar18._12_4_;
        uStack_490._0_4_ = auVar18._16_4_;
        uStack_490._4_4_ = auVar18._20_4_;
        uStack_488._0_4_ = auVar18._24_4_;
        uStack_488._4_4_ = auVar18._28_4_;
        local_8c0._4_4_ = local_4a0._4_4_ * local_6a0._4_4_;
        local_8c0._0_4_ = (float)local_4a0 * (float)local_6a0;
        uStack_8b8._0_4_ = (float)uStack_498 * (float)uStack_698;
        uStack_8b8._4_4_ = uStack_498._4_4_ * uStack_698._4_4_;
        uStack_8b0._0_4_ = (float)uStack_490 * (float)uStack_690;
        uStack_8b0._4_4_ = uStack_490._4_4_ * uStack_690._4_4_;
        auVar14 = _local_8c0;
        uStack_8a8._0_4_ = (float)uStack_488 * (float)uStack_688;
        uStack_8a8._4_4_ = uStack_488._4_4_;
        auVar18 = _local_8c0;
        local_408 = local_7b0;
        local_440 = local_8c0;
        uStack_438 = uStack_8b8;
        uStack_8b0 = auVar14._16_8_;
        uStack_430 = uStack_8b0;
        uStack_8a8 = auVar18._24_8_;
        uStack_428 = uStack_8a8;
        *(undefined1 (*) [8])local_7b0 = local_8c0;
        *(undefined8 *)(local_7b0 + 2) = uStack_8b8;
        *(undefined8 *)(local_7b0 + 4) = uStack_8b0;
        *(undefined8 *)(local_7b0 + 6) = uStack_8a8;
        local_7b0 = local_7b0 + 8;
        _local_8c0 = auVar18;
        local_6a0 = local_8a0;
        uStack_698 = uStack_898;
        uStack_690 = uStack_890;
        uStack_688 = uStack_888;
        local_580 = local_200._0_8_;
        uStack_578 = local_200._8_8_;
        uStack_570 = local_200._16_8_;
        uStack_568 = local_200._24_8_;
        local_4c0 = local_8a0;
        uStack_4b8 = uStack_898;
        uStack_4b0 = uStack_890;
        uStack_4a8 = uStack_888;
        local_4a0 = uVar5;
        uStack_498 = uVar6;
        uStack_490 = uVar7;
        uStack_488 = uVar8;
        local_220 = local_75c;
        local_21c = local_75c;
        local_218 = local_75c;
        local_214 = local_75c;
        local_210 = local_75c;
        local_20c = local_75c;
        local_208 = local_75c;
        local_204 = local_75c;
        local_200 = auVar17;
        local_1e0 = local_760;
        local_1dc = local_760;
        local_1d8 = local_760;
        local_1d4 = local_760;
        local_1d0 = local_760;
        local_1cc = local_760;
        local_1c8 = local_760;
        local_1c4 = local_760;
        local_c0 = local_240._0_8_;
        uStack_b8 = local_240._8_8_;
        uStack_b0 = auStack_230._0_8_;
        uStack_a8 = auStack_230._8_8_;
        fStack_84 = fStack_544;
      }
      local_280 = auVar16;
    }
  }
  else if (local_7a4 == 4) {
    local_7a4 = 4;
    for (local_8c4 = 0; local_8c4 < local_79c; local_8c4 = local_8c4 + 1) {
      this_00 = &local_918;
      ncnn::Mat::channel(in_stack_fffffffffffff570,(int)((ulong)this_00 >> 0x20));
      in_stack_fffffffffffff570 = (Mat *)ncnn::Mat::operator_cast_to_float_(this_00);
      ncnn::Mat::~Mat((Mat *)0x8e833d);
      local_38c = 0;
      local_3a0 = 0;
      uStack_39c = 0;
      uStack_398 = 0;
      uStack_394 = 0;
      local_930 = 0;
      uStack_928 = 0;
      local_3a4 = 0x3f800000;
      local_3c0 = 0x3f800000;
      uStack_3bc = 0x3f800000;
      uStack_3b8 = 0x3f800000;
      uStack_3b4 = 0x3f800000;
      local_940 = 0x3f8000003f800000;
      uStack_938 = 0x3f8000003f800000;
      local_8d0 = in_stack_fffffffffffff570;
      for (local_944 = 0; local_944 < local_7a0; local_944 = local_944 + 1) {
        local_388 = local_8d0;
        local_960 = local_8d0->data;
        piStack_958 = local_8d0->refcount;
        local_3e0 = *(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
        local_380 = CONCAT44(local_3e0,local_3e0);
        uStack_378 = CONCAT44(local_3e0,local_3e0);
        local_400 = *(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
        local_340 = CONCAT44(local_400,local_400);
        uStack_338 = CONCAT44(local_400,local_400);
        local_330._0_4_ = SUB84(local_960,0);
        local_330._4_4_ = (float)((ulong)local_960 >> 0x20);
        uStack_328._0_4_ = SUB84(piStack_958,0);
        uStack_328._4_4_ = (float)((ulong)piStack_958 >> 0x20);
        local_370 = (float)local_330 * local_400;
        fStack_36c = local_330._4_4_ * local_400;
        fStack_368 = (float)uStack_328 * local_400;
        fStack_364 = uStack_328._4_4_ * local_400;
        local_970 = (void *)CONCAT44(fStack_36c + local_3e0,local_370 + local_3e0);
        uStack_968._0_4_ = fStack_368 + local_3e0;
        uStack_968._4_4_ = fStack_364 + local_3e0;
        local_310 = local_970;
        uStack_308 = uStack_968;
        auVar1._8_8_ = uStack_968;
        auVar1._0_8_ = local_970;
        auVar1 = vmaxps_avx(auVar1,ZEXT816(0));
        local_970 = auVar1._0_8_;
        local_2f0 = local_970;
        uStack_968 = auVar1._8_8_;
        uStack_2e8 = uStack_968;
        auVar2._8_8_ = 0x3f8000003f800000;
        auVar2._0_8_ = 0x3f8000003f800000;
        auVar1 = vminps_avx(auVar1,auVar2);
        local_970 = auVar1._0_8_;
        uVar5 = local_970;
        uStack_968 = auVar1._8_8_;
        uVar6 = uStack_968;
        local_350._0_4_ = auVar1._0_4_;
        local_350._4_4_ = auVar1._4_4_;
        uStack_348._0_4_ = auVar1._8_4_;
        uStack_348._4_4_ = auVar1._12_4_;
        local_970 = (void *)CONCAT44(local_350._4_4_ * local_330._4_4_,
                                     (float)local_350 * (float)local_330);
        uStack_968._0_4_ = (float)uStack_348 * (float)uStack_328;
        uStack_968._4_4_ = uStack_348._4_4_ * uStack_328._4_4_;
        local_2c8 = local_8d0;
        local_2e0 = local_970;
        piStack_2d8 = uStack_968;
        local_8d0->data = local_970;
        local_8d0->refcount = uStack_968;
        local_8d0 = (Mat *)&local_8d0->elemsize;
        fStack_3fc = local_400;
        fStack_3f8 = local_400;
        fStack_3f4 = local_400;
        local_3e4 = local_400;
        fStack_3dc = local_3e0;
        fStack_3d8 = local_3e0;
        fStack_3d4 = local_3e0;
        local_3c4 = local_3e0;
        local_360 = local_960;
        piStack_358 = piStack_958;
        local_350 = uVar5;
        uStack_348 = uVar6;
        local_330 = local_960;
        uStack_328 = piStack_958;
        local_320 = local_930;
        uStack_318 = uStack_928;
        local_300 = local_940;
        uStack_2f8 = uStack_938;
      }
    }
  }
  else {
    for (local_974 = 0; local_974 < local_79c; local_974 = local_974 + 1) {
      ncnn::Mat::channel(in_stack_fffffffffffff570,(int)((ulong)in_stack_fffffffffffff568 >> 0x20));
      pfVar15 = ncnn::Mat::operator_cast_to_float_(&local_9c8);
      ncnn::Mat::~Mat((Mat *)0x8e869e);
      local_9cc = 0;
      local_764 = 0;
      local_184 = 0;
      local_188 = 0;
      local_18c = 0;
      local_190 = 0;
      local_194 = 0;
      local_198 = 0;
      local_19c = 0;
      local_1a0 = 0;
      auVar1 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
      auVar1 = vinsertps_avx(auVar1,ZEXT416(0),0x20);
      local_1c0 = vinsertps_avx(auVar1,ZEXT416(0),0x30);
      auVar1 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
      auVar1 = vinsertps_avx(auVar1,ZEXT416(0),0x20);
      auStack_1b0 = vinsertps_avx(auVar1,ZEXT416(0),0x30);
      local_768 = 0x3f800000;
      local_144 = 0x3f800000;
      local_148 = 0x3f800000;
      local_14c = 0x3f800000;
      local_150 = 0x3f800000;
      local_154 = 0x3f800000;
      local_158 = 0x3f800000;
      local_15c = 0x3f800000;
      local_160 = 0x3f800000;
      auVar1 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar1 = vinsertps_avx(auVar1,ZEXT416(0x3f800000),0x20);
      auVar1 = vinsertps_avx(auVar1,ZEXT416(0x3f800000),0x30);
      auVar2 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x20);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x30);
      auVar18._16_16_ = auVar1;
      auVar18._0_16_ = auVar2;
      local_180._0_8_ = auVar2._0_8_;
      local_180._8_8_ = auVar2._8_8_;
      local_180._16_8_ = auVar1._0_8_;
      local_180._24_8_ = auVar1._8_8_;
      local_980 = pfVar15;
      for (; local_9cc + 7 < local_7a0; local_9cc = local_9cc + 8) {
        local_750 = local_980;
        local_500 = *(undefined8 *)local_980;
        uStack_4f8 = *(undefined8 *)(local_980 + 2);
        uStack_4f0 = *(undefined8 *)(local_980 + 4);
        uStack_4e8 = *(undefined8 *)(local_980 + 6);
        local_76c = *(uint *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
        auVar1 = vinsertps_avx(ZEXT416(local_76c),ZEXT416(local_76c),0x10);
        auVar1 = vinsertps_avx(auVar1,ZEXT416(local_76c),0x20);
        local_140 = vinsertps_avx(auVar1,ZEXT416(local_76c),0x30);
        auVar1 = vinsertps_avx(ZEXT416(local_76c),ZEXT416(local_76c),0x10);
        auVar1 = vinsertps_avx(auVar1,ZEXT416(local_76c),0x20);
        auStack_130 = vinsertps_avx(auVar1,ZEXT416(local_76c),0x30);
        local_770 = *(uint *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
        auVar1 = vinsertps_avx(ZEXT416(local_770),ZEXT416(local_770),0x10);
        auVar1 = vinsertps_avx(auVar1,ZEXT416(local_770),0x20);
        auVar1 = vinsertps_avx(auVar1,ZEXT416(local_770),0x30);
        auVar3 = vinsertps_avx(ZEXT416(local_770),ZEXT416(local_770),0x10);
        auVar3 = vinsertps_avx(auVar3,ZEXT416(local_770),0x20);
        auVar3 = vinsertps_avx(auVar3,ZEXT416(local_770),0x30);
        auVar19._16_16_ = auVar1;
        auVar19._0_16_ = auVar3;
        local_100._0_8_ = auVar3._0_8_;
        local_720 = local_100._0_8_;
        local_100._8_8_ = auVar3._8_8_;
        uStack_718 = local_100._8_8_;
        local_100._16_8_ = auVar1._0_8_;
        uStack_710 = local_100._16_8_;
        local_100._24_8_ = auVar1._8_8_;
        uStack_708 = local_100._24_8_;
        local_740 = local_140._0_8_;
        uStack_738 = local_140._8_8_;
        uStack_730 = auStack_130._0_8_;
        uStack_728 = auStack_130._8_8_;
        local_700._0_4_ = (float)local_500;
        local_520 = (float)local_700;
        local_700._4_4_ = (float)((ulong)local_500 >> 0x20);
        fStack_51c = local_700._4_4_;
        uStack_6f8._0_4_ = (float)uStack_4f8;
        fStack_518 = (float)uStack_6f8;
        uStack_6f8._4_4_ = (float)((ulong)uStack_4f8 >> 0x20);
        fStack_514 = uStack_6f8._4_4_;
        uStack_6f0._0_4_ = (float)uStack_4f0;
        fStack_510 = (float)uStack_6f0;
        uStack_6f0._4_4_ = (float)((ulong)uStack_4f0 >> 0x20);
        fStack_50c = uStack_6f0._4_4_;
        uStack_6e8._0_4_ = (float)uStack_4e8;
        fStack_508 = (float)uStack_6e8;
        uStack_6e8._4_4_ = (float)((ulong)uStack_4e8 >> 0x20);
        fStack_504 = uStack_6e8._4_4_;
        local_540._0_4_ = auVar3._0_4_;
        local_540._4_4_ = auVar3._4_4_;
        uStack_538._0_4_ = auVar3._8_4_;
        uStack_538._4_4_ = auVar3._12_4_;
        uStack_530._0_4_ = auVar1._0_4_;
        uStack_530._4_4_ = auVar1._4_4_;
        uStack_528._0_4_ = auVar1._8_4_;
        local_60 = (float)local_700 * (float)local_540;
        fStack_5c = local_700._4_4_ * local_540._4_4_;
        fStack_58 = (float)uStack_6f8 * (float)uStack_538;
        fStack_54 = uStack_6f8._4_4_ * uStack_538._4_4_;
        fStack_50 = (float)uStack_6f0 * (float)uStack_530;
        fStack_4c = uStack_6f0._4_4_ * uStack_530._4_4_;
        fStack_48 = (float)uStack_6e8 * (float)uStack_528;
        local_80._0_4_ = local_140._0_4_;
        local_80._4_4_ = local_140._4_4_;
        uStack_78._0_4_ = local_140._8_4_;
        uStack_78._4_4_ = local_140._12_4_;
        uStack_70._0_4_ = auStack_130._0_4_;
        uStack_70._4_4_ = auStack_130._4_4_;
        uStack_68._0_4_ = auStack_130._8_4_;
        uStack_68._4_4_ = auStack_130._12_4_;
        local_a60._4_4_ = fStack_5c + local_80._4_4_;
        local_a60._0_4_ = local_60 + (float)local_80;
        uStack_a58._0_4_ = fStack_58 + (float)uStack_78;
        uStack_a58._4_4_ = fStack_54 + uStack_78._4_4_;
        uStack_a50._0_4_ = fStack_50 + (float)uStack_70;
        uStack_a50._4_4_ = fStack_4c + uStack_70._4_4_;
        auVar14 = _local_a60;
        uStack_a48._0_4_ = fStack_48 + (float)uStack_68;
        uStack_a48._4_4_ = uStack_6e8._4_4_ + uStack_68._4_4_;
        auVar4 = _local_a60;
        local_660 = local_a60;
        uStack_658 = uStack_a58;
        uStack_a50 = auVar14._16_8_;
        uStack_650 = uStack_a50;
        uStack_a48 = auVar4._24_8_;
        uStack_648 = uStack_a48;
        local_680 = local_1c0._0_8_;
        uStack_678 = local_1c0._8_8_;
        uStack_670 = auStack_1b0._0_8_;
        uStack_668 = auStack_1b0._8_8_;
        auVar9._16_8_ = uStack_a50;
        auVar9._0_16_ = _local_a60;
        auVar9._24_8_ = uStack_a48;
        auVar4._16_8_ = auStack_1b0._0_8_;
        auVar4._0_16_ = local_1c0;
        auVar4._24_8_ = auStack_1b0._8_8_;
        auVar4 = vmaxps_avx(auVar9,auVar4);
        local_a60 = auVar4._0_8_;
        local_5e0 = local_a60;
        uStack_a58 = auVar4._8_8_;
        uStack_5d8 = uStack_a58;
        uStack_a50 = auVar4._16_8_;
        uStack_5d0 = uStack_a50;
        uStack_a48 = auVar4._24_8_;
        uStack_5c8 = uStack_a48;
        local_600 = local_180._0_8_;
        uStack_5f8 = local_180._8_8_;
        uStack_5f0 = local_180._16_8_;
        uStack_5e8 = local_180._24_8_;
        auVar12._16_8_ = local_180._16_8_;
        auVar12._0_16_ = auVar2;
        auVar12._24_8_ = local_180._24_8_;
        auVar4 = vminps_avx(auVar4,auVar12);
        local_a60 = auVar4._0_8_;
        uVar5 = local_a60;
        uStack_a58 = auVar4._8_8_;
        uVar6 = uStack_a58;
        uStack_a50 = auVar4._16_8_;
        uVar7 = uStack_a50;
        uStack_a48 = auVar4._24_8_;
        uVar8 = uStack_a48;
        local_4e0._0_4_ = auVar4._0_4_;
        local_4e0._4_4_ = auVar4._4_4_;
        uStack_4d8._0_4_ = auVar4._8_4_;
        uStack_4d8._4_4_ = auVar4._12_4_;
        uStack_4d0._0_4_ = auVar4._16_4_;
        uStack_4d0._4_4_ = auVar4._20_4_;
        uStack_4c8._0_4_ = auVar4._24_4_;
        uStack_4c8._4_4_ = auVar4._28_4_;
        local_a60._4_4_ = local_4e0._4_4_ * local_700._4_4_;
        local_a60._0_4_ = (float)local_4e0 * (float)local_700;
        uStack_a58._0_4_ = (float)uStack_4d8 * (float)uStack_6f8;
        uStack_a58._4_4_ = uStack_4d8._4_4_ * uStack_6f8._4_4_;
        uStack_a50._0_4_ = (float)uStack_4d0 * (float)uStack_6f0;
        uStack_a50._4_4_ = uStack_4d0._4_4_ * uStack_6f0._4_4_;
        auVar14 = _local_a60;
        uStack_a48._0_4_ = (float)uStack_4c8 * (float)uStack_6e8;
        uStack_a48._4_4_ = uStack_4c8._4_4_;
        auVar4 = _local_a60;
        local_448 = local_980;
        local_480 = local_a60;
        uStack_478 = uStack_a58;
        uStack_a50 = auVar14._16_8_;
        uStack_470 = uStack_a50;
        uStack_a48 = auVar4._24_8_;
        uStack_468 = uStack_a48;
        *(undefined1 (*) [8])local_980 = local_a60;
        *(undefined8 *)(local_980 + 2) = uStack_a58;
        *(undefined8 *)(local_980 + 4) = uStack_a50;
        *(undefined8 *)(local_980 + 6) = uStack_a48;
        local_980 = local_980 + 8;
        local_700 = local_500;
        uStack_6f8 = uStack_4f8;
        uStack_6f0 = uStack_4f0;
        uStack_6e8 = uStack_4e8;
        local_540 = local_100._0_8_;
        uStack_538 = local_100._8_8_;
        uStack_530 = local_100._16_8_;
        uStack_528 = local_100._24_8_;
        local_4e0 = uVar5;
        uStack_4d8 = uVar6;
        uStack_4d0 = uVar7;
        uStack_4c8 = uVar8;
        local_120 = local_76c;
        local_11c = local_76c;
        local_118 = local_76c;
        local_114 = local_76c;
        local_110 = local_76c;
        local_10c = local_76c;
        local_108 = local_76c;
        local_104 = local_76c;
        local_100 = auVar19;
        local_e0 = local_770;
        local_dc = local_770;
        local_d8 = local_770;
        local_d4 = local_770;
        local_d0 = local_770;
        local_cc = local_770;
        local_c8 = local_770;
        local_c4 = local_770;
        local_80 = local_140._0_8_;
        uStack_78 = local_140._8_8_;
        uStack_70 = auStack_130._0_8_;
        uStack_68 = auStack_130._8_8_;
        fStack_44 = fStack_504;
      }
      for (; local_9cc < local_7a0; local_9cc = local_9cc + 1) {
        if (*(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) <= *local_980) {
          if (*local_980 <= *(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc)) {
            *local_980 = *local_980 *
                         (*local_980 * *(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0)
                         + *(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4));
          }
        }
        else {
          *local_980 = 0.0;
        }
        local_980 = local_980 + 1;
      }
      local_180 = auVar18;
    }
  }
  return 0;
}

Assistant:

int HardSwish_x86_avx::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;
#if __SSE2__
    int elempack = bottom_top_blob.elempack;

#if __AVX__
    if (elempack == 8)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            __m256 _zero = _mm256_set1_ps(0.f);
            __m256 _one = _mm256_set1_ps(1.f);
            for (int i = 0; i < size; i++)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _ans = _mm256_set1_ps(beta);
                _ans = _mm256_comp_fmadd_ps(_p, _mm256_set1_ps(alpha), _ans);
                _ans = _mm256_max_ps(_ans, _zero);
                _ans = _mm256_min_ps(_ans, _one);
                _ans = _mm256_mul_ps(_ans, _p);
                _mm256_storeu_ps(ptr, _ans);

                ptr += 8;
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            __m128 _zero = _mm_set1_ps(0.f);
            __m128 _one = _mm_set1_ps(1.f);
            for (int i = 0; i < size; i++)
            {
                __m128 _p = _mm_loadu_ps(ptr);
                __m128 _ans = _mm_set1_ps(beta);
                _ans = _mm_add_ps(_mm_mul_ps(_p, _mm_set1_ps(alpha)), _ans);
                _ans = _mm_max_ps(_ans, _zero);
                _ans = _mm_min_ps(_ans, _one);
                _ans = _mm_mul_ps(_ans, _p);
                _mm_storeu_ps(ptr, _ans);

                ptr += 4;
            }
        }

        return 0;
    }
#endif // __SSE2__

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __AVX__
        __m256 _zero = _mm256_set1_ps(0.f);
        __m256 _one = _mm256_set1_ps(1.f);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _ans = _mm256_set1_ps(beta);
            _ans = _mm256_comp_fmadd_ps(_p, _mm256_set1_ps(alpha), _ans);
            _ans = _mm256_max_ps(_ans, _zero);
            _ans = _mm256_min_ps(_ans, _one);
            _ans = _mm256_mul_ps(_ans, _p);
            _mm256_storeu_ps(ptr, _ans);

            ptr += 8;
        }
#endif
        for (; i < size; i++)
        {
            if (*ptr < lower)
                *ptr = 0.f;
            else if (*ptr > upper)
                ;
            else
                *ptr = *ptr * (*ptr * alpha + beta);
            ++ptr;
        }
    }

    return 0;
}